

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O2

void __thiscall libchars::edit_object::~edit_object(edit_object *this)

{
  char *pcVar1;
  size_t sVar2;
  
  this->_vptr_edit_object = (_func_int **)&PTR__edit_object_0011ecd8;
  if (this->buflen != 0) {
    pcVar1 = this->buffer + (this->buflen - 1);
    sVar2 = 1;
    while (sVar2 != 0) {
      *pcVar1 = '\0';
      sVar2 = this->buflen - 1;
      this->buflen = sVar2;
      pcVar1 = pcVar1 + -1;
    }
  }
  std::__cxx11::string::~string((string *)&this->prompt);
  return;
}

Assistant:

virtual ~edit_object() {
            // securely wipe contents of buffer
            if (buflen > 0) {
                volatile char *p = buffer + buflen - 1;
                while (buflen > 0) {
                    *p-- = 0;
                    --buflen;
                }
            }
        }